

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaWMR.cpp
# Opt level: O1

void __thiscall NaWMR::SetParameters(NaWMR *this,NaParams *params)

{
  char *pcVar1;
  double dVar2;
  
  pcVar1 = NaParams::GetParam(params,"base_length");
  dVar2 = atof(pcVar1);
  (this->par).l = dVar2;
  pcVar1 = NaParams::GetParam(params,"mass_offset");
  dVar2 = atof(pcVar1);
  (this->par).b = dVar2;
  pcVar1 = NaParams::GetParam(params,"wheel_radius");
  dVar2 = atof(pcVar1);
  (this->par).r = dVar2;
  pcVar1 = NaParams::GetParam(params,"total_mass");
  dVar2 = atof(pcVar1);
  (this->par).m = dVar2;
  pcVar1 = NaParams::GetParam(params,"inertia_z");
  dVar2 = atof(pcVar1);
  (this->par).iz = dVar2;
  pcVar1 = NaParams::GetParam(params,"motor_resist");
  dVar2 = atof(pcVar1);
  (this->par).R = dVar2;
  pcVar1 = NaParams::GetParam(params,"motor_induct");
  dVar2 = atof(pcVar1);
  (this->par).L = dVar2;
  pcVar1 = NaParams::GetParam(params,"motor_Kw");
  dVar2 = atof(pcVar1);
  (this->par).Kw = dVar2;
  pcVar1 = NaParams::GetParam(params,"motor_Km");
  dVar2 = atof(pcVar1);
  (this->par).Km = dVar2;
  pcVar1 = NaParams::GetParam(params,"reductor_ratio");
  dVar2 = atof(pcVar1);
  (this->par).i = dVar2;
  return;
}

Assistant:

void
NaWMR::SetParameters (const NaParams& params)
{
  par.l = atof(params("base_length"));	/**< distance between motor wheels */
  par.b = atof(params("mass_offset"));	/**< distance between wheels axis and
					   center of mass */
  par.r = atof(params("wheel_radius"));	/**< radius of the wheel */
  par.m = atof(params("total_mass"));	/**< mass of the robot */
  par.iz = atof(params("inertia_z"));	/**< moment of inertia of the robot
					   around vertical axis */
  par.R = atof(params("motor_resist"));	/**< electic resistance */
  par.L = atof(params("motor_induct"));	/**< induction */
  par.Kw = atof(params("motor_Kw"));	/**< coefficient 1 */
  par.Km = atof(params("motor_Km"));	/**< coefficient 2 */
  par.i = atof(params("reductor_ratio"));/**< reductor ratio */
}